

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O0

QJsonValue * __thiscall QJsonObject::valueAt(QJsonObject *this,qsizetype i)

{
  bool bVar1;
  QCborValue *v;
  QCborContainerPrivate *pQVar2;
  qsizetype qVar3;
  long in_RDX;
  undefined8 in_RSI;
  QCborContainerPrivate *in_RDI;
  long in_FS_OFFSET;
  QCborValue *this_00;
  QCborContainerPrivate *this_01;
  Type type;
  QJsonValue *in_stack_ffffffffffffffb8;
  QCborValue local_20;
  long local_8;
  
  type = (Type)((ulong)in_RSI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  bVar1 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator!
                    ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x4922b1);
  if ((!bVar1) && (-1 < in_RDX)) {
    v = (QCborValue *)(in_RDX * 2 + 1);
    pQVar2 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x4922d8);
    qVar3 = QList<QtCbor::Element>::size(&pQVar2->elements);
    if ((long)v < qVar3) {
      QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x49230c);
      this_00 = &local_20;
      QCborContainerPrivate::valueAt(this_01,(qsizetype)in_RDI);
      QJsonPrivate::Value::fromTrustedCbor(v);
      ::QCborValue::~QCborValue(this_00);
      goto LAB_00492363;
    }
  }
  QJsonValue::QJsonValue(in_stack_ffffffffffffffb8,type);
LAB_00492363:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QJsonValue *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

QJsonValue QJsonObject::valueAt(qsizetype i) const
{
    if (!o || i < 0 || 2 * i + 1 >= o->elements.size())
        return QJsonValue(QJsonValue::Undefined);
    return QJsonPrivate::Value::fromTrustedCbor(o->valueAt(2 * i + 1));
}